

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintNgeneric.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintNgeneric::ChConstraintNgeneric
          (ChConstraintNgeneric *this,ChConstraintNgeneric *other)

{
  ChConstraint::ChConstraint(&this->super_ChConstraint,&other->super_ChConstraint);
  (this->super_ChConstraint)._vptr_ChConstraint = (_func_int **)&PTR__ChConstraintNgeneric_00b63380;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->variables).
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Cq).
  super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Cq).
  super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Cq).
  super__Vector_base<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Eq).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Eq).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Eq).
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::operator=
            (&this->variables,&other->variables);
  std::
  vector<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_std::allocator<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
  ::operator=(&this->Cq,&other->Cq);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::operator=(&this->Eq,&other->Eq);
  return;
}

Assistant:

ChConstraintNgeneric::ChConstraintNgeneric(const ChConstraintNgeneric& other) : ChConstraint(other) {
    variables = other.variables;
    Cq = other.Cq;
    Eq = other.Eq;
}